

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

_Bool tcg_can_emit_vecop_list_m68k
                (TCGContext_conflict2 *tcg_ctx,TCGOpcode *list,TCGType_conflict type,uint vece)

{
  int iVar1;
  TCGOpcode TVar2;
  _Bool _Var3;
  
  if (list == (TCGOpcode *)0x0) {
    _Var3 = true;
  }
  else {
    while( true ) {
      TVar2 = *list;
      _Var3 = TVar2 == INDEX_op_discard;
      if (_Var3) break;
      iVar1 = tcg_can_emit_vec_op_m68k(tcg_ctx,TVar2,type,vece);
      if (iVar1 == 0) {
        if ((TVar2 - INDEX_op_smin_vec < 4) || (TVar2 == INDEX_op_cmpsel_vec)) {
LAB_006619f1:
          TVar2 = INDEX_op_cmp_vec;
        }
        else {
          if (TVar2 == INDEX_op_abs_vec) {
            iVar1 = tcg_can_emit_vec_op_m68k(tcg_ctx,INDEX_op_sub_vec,type,vece);
            if (iVar1 == 0) {
              return _Var3;
            }
            iVar1 = tcg_can_emit_vec_op_m68k(tcg_ctx,INDEX_op_smax_vec,type,vece);
            if ((0 < iVar1) ||
               (iVar1 = tcg_can_emit_vec_op_m68k(tcg_ctx,INDEX_op_sari_vec,type,vece), 0 < iVar1))
            goto LAB_00661a06;
            goto LAB_006619f1;
          }
          if (TVar2 != INDEX_op_neg_vec) {
            return _Var3;
          }
          TVar2 = INDEX_op_sub_vec;
        }
        iVar1 = tcg_can_emit_vec_op_m68k(tcg_ctx,TVar2,type,vece);
        if (iVar1 == 0) {
          return _Var3;
        }
      }
LAB_00661a06:
      list = list + 1;
    }
  }
  return _Var3;
}

Assistant:

bool tcg_can_emit_vecop_list(TCGContext *tcg_ctx, const TCGOpcode *list,
                             TCGType type, unsigned vece)
{
    if (list == NULL) {
        return true;
    }

    for (; *list; ++list) {
        TCGOpcode opc = *list;

#ifdef CONFIG_DEBUG_TCG
        switch (opc) {
        case INDEX_op_and_vec:
        case INDEX_op_or_vec:
        case INDEX_op_xor_vec:
        case INDEX_op_mov_vec:
        case INDEX_op_dup_vec:
        case INDEX_op_dupi_vec:
        case INDEX_op_dup2_vec:
        case INDEX_op_ld_vec:
        case INDEX_op_st_vec:
        case INDEX_op_bitsel_vec:
            /* These opcodes are mandatory and should not be listed.  */
            g_assert_not_reached();
        case INDEX_op_not_vec:
            /* These opcodes have generic expansions using the above.  */
            g_assert_not_reached();
        default:
            break;
        }
#endif

        if (tcg_can_emit_vec_op(tcg_ctx, opc, type, vece)) {
            continue;
        }

        /*
         * The opcode list is created by front ends based on what they
         * actually invoke.  We must mirror the logic in the routines
         * below for generic expansions using other opcodes.
         */
        switch (opc) {
        case INDEX_op_neg_vec:
            if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sub_vec, type, vece)) {
                continue;
            }
            break;
        case INDEX_op_abs_vec:
            if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sub_vec, type, vece)
                && (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_smax_vec, type, vece) > 0
                    || tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sari_vec, type, vece) > 0
                    || tcg_can_emit_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece))) {
                continue;
            }
            break;
        case INDEX_op_cmpsel_vec:
        case INDEX_op_smin_vec:
        case INDEX_op_smax_vec:
        case INDEX_op_umin_vec:
        case INDEX_op_umax_vec:
            if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece)) {
                continue;
            }
            break;
        default:
            break;
        }
        return false;
    }
    return true;
}